

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QPoint __thiscall QWidget::pos(QWidget *this)

{
  uint uVar1;
  uint uVar2;
  QWidgetData *pQVar3;
  QWExtra *pQVar4;
  ulong uVar5;
  uint uVar6;
  QRect QVar7;
  
  pQVar3 = this->data;
  uVar1 = (pQVar3->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  uVar6 = (pQVar3->crect).x1.m_i;
  uVar2 = (pQVar3->crect).y1.m_i;
  uVar5 = (ulong)uVar2;
  if ((uVar1 & 0xff) != 9 && (uVar1 & 1) != 0) {
    pQVar4 = ((*(QWidgetPrivate **)&this->field_0x8)->extra)._M_t.
             super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if (((pQVar4 == (QWExtra *)0x0) ||
        ((_Head_base<0UL,_QTLWExtra_*,_false>)
         *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
          &(pQVar4->topextra)._M_t.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>
         == (QTLWExtra *)0x0)) ||
       ((*(byte *)((long)(pQVar4->topextra)._M_t.
                         super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0xe1) &
        1) == 0)) {
      QVar7 = QWidgetPrivate::frameStrut(*(QWidgetPrivate **)&this->field_0x8);
      uVar6 = uVar6 - QVar7.x1.m_i;
      uVar5 = (ulong)(uVar2 - QVar7.y1.m_i);
    }
  }
  return (QPoint)((ulong)uVar6 | uVar5 << 0x20);
}

Assistant:

QPoint QWidget::pos() const
{
    Q_D(const QWidget);
    QPoint result = data->crect.topLeft();
    if (isWindow() && ! (windowType() == Qt::Popup))
        if (!d->maybeTopData() || !d->maybeTopData()->posIncludesFrame)
            result -= d->frameStrut().topLeft();
    return result;
}